

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void luaV_concat(lua_State *L,int total,int last)

{
  StkId pTVar1;
  Table *pTVar2;
  global_State *pgVar3;
  int iVar4;
  char *str;
  GCObject *pGVar5;
  uint uVar6;
  int iVar7;
  StkId pTVar8;
  TValue *p1;
  Table *pTVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  size_t l;
  uint local_50;
  
  local_50 = total;
  do {
    pTVar1 = L->base;
    pTVar8 = pTVar1 + last;
    p1 = pTVar1 + (long)last + -1;
    if (pTVar1[(long)last + -1].tt - 3U < 2) {
      if (pTVar8->tt != 4) {
        iVar4 = luaV_tostring(L,pTVar8);
        if (iVar4 == 0) goto LAB_00104c60;
      }
      pTVar9 = (((pTVar8->value).gc)->h).metatable;
      if (pTVar9 == (Table *)0x0) {
        iVar7 = 1;
        if (pTVar8[-1].tt != 4) {
          luaV_tostring(L,p1);
          iVar7 = 1;
        }
      }
      else {
        uVar6 = 1;
        if (1 < (int)local_50) {
          uVar6 = local_50;
        }
        for (lVar10 = 1; lVar10 < (int)local_50; lVar10 = lVar10 + 1) {
          if (p1->tt != 4) {
            iVar4 = luaV_tostring(L,p1);
            if (iVar4 == 0) {
              uVar6 = (uint)lVar10;
              break;
            }
          }
          pTVar2 = (((p1->value).gc)->h).metatable;
          if ((Table *)(-(long)pTVar9 - 3U) <= pTVar2) {
            luaG_runerror(L,"string length overflow");
          }
          pTVar9 = (Table *)((long)&pTVar2->next + (long)&pTVar9->next);
          p1 = p1 + -1;
        }
        pgVar3 = L->l_G;
        pTVar2 = (Table *)(pgVar3->buff).buffsize;
        if (pTVar2 < pTVar9) {
          if (pTVar9 < (Table *)0x21) {
            pTVar9 = (Table *)0x20;
          }
          if ((undefined1 *)0xfffffffffffffffd < (undefined1 *)((long)&pTVar9->next + 1U)) {
            luaM_toobig(L);
          }
          str = (char *)luaM_realloc_(L,(pgVar3->buff).buffer,(size_t)pTVar2,(size_t)pTVar9);
          (pgVar3->buff).buffer = str;
          (pgVar3->buff).buffsize = (size_t)pTVar9;
        }
        else {
          str = (pgVar3->buff).buffer;
        }
        uVar11 = (ulong)uVar6;
        pTVar8 = pTVar1 + ((long)last - uVar11);
        l = 0;
        for (uVar12 = uVar11; pTVar8 = pTVar8 + 1, 0 < (long)uVar12; uVar12 = uVar12 - 1) {
          pTVar9 = (((pTVar8->value).gc)->h).metatable;
          memcpy(str + l,&(((pTVar8->value).gc)->h).array,(size_t)pTVar9);
          l = (long)&pTVar9->next + l;
        }
        pGVar5 = (GCObject *)luaS_newlstr(L,str,l);
        pTVar1[(long)last + (1 - uVar11)].value.gc = pGVar5;
        pTVar1[(long)last + (1 - uVar11)].tt = 4;
        iVar7 = uVar6 - 1;
      }
    }
    else {
LAB_00104c60:
      iVar4 = call_binTM(L,p1,pTVar8,p1,TM_CONCAT);
      iVar7 = 1;
      if (iVar4 == 0) {
        if (pTVar8[-1].tt - 3U < 2) {
          p1 = pTVar8;
        }
        luaG_typeerror(L,p1,"concatenate");
      }
    }
    local_50 = local_50 - iVar7;
    last = last - iVar7;
    if ((int)local_50 < 2) {
      return;
    }
  } while( true );
}

Assistant:

static void luaV_concat(lua_State*L,int total,int last){
do{
StkId top=L->base+last+1;
int n=2;
if(!(ttisstring(top-2)||ttisnumber(top-2))||!tostring(L,top-1)){
if(!call_binTM(L,top-2,top-1,top-2,TM_CONCAT))
luaG_concaterror(L,top-2,top-1);
}else if(tsvalue(top-1)->len==0)
(void)tostring(L,top-2);
else{
size_t tl=tsvalue(top-1)->len;
char*buffer;
int i;
for(n=1;n<total&&tostring(L,top-n-1);n++){
size_t l=tsvalue(top-n-1)->len;
if(l>=((size_t)(~(size_t)0)-2)-tl)luaG_runerror(L,"string length overflow");
tl+=l;
}
buffer=luaZ_openspace(L,&G(L)->buff,tl);
tl=0;
for(i=n;i>0;i--){
size_t l=tsvalue(top-i)->len;
memcpy(buffer+tl,svalue(top-i),l);
tl+=l;
}
setsvalue(L,top-n,luaS_newlstr(L,buffer,tl));
}
total-=n-1;
last-=n-1;
}while(total>1);
}